

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          string *linkLibs,string *flags,string *linkFlags,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *target)

{
  cmOutputConverter *this_00;
  cmMakefile *pcVar1;
  cmSourceFile *this_01;
  bool bVar2;
  TargetType TVar3;
  string *psVar4;
  _Alloc_hider _Var5;
  char *pcVar6;
  string configLinkFlags;
  string buildType;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string linkLanguage;
  allocator local_121;
  cmLocalGenerator *local_120;
  string local_118;
  allocator local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  cmComputeLinkInformation *local_d0;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  cmLinkLineComputer *local_88;
  string *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string *local_38;
  
  local_120 = this;
  local_80 = linkLibs;
  cmsys::SystemTools::UpperCase(&local_c8,config);
  local_d0 = cmGeneratorTarget::GetLinkInformation(target,config);
  local_88 = linkLineComputer;
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(&local_58,linkLineComputer,target,&local_c8);
  TVar3 = cmGeneratorTarget::GetType(target);
  switch(TVar3) {
  case EXECUTABLE:
    pcVar1 = local_120->Makefile;
    std::__cxx11::string::string
              ((string *)&local_118,"CMAKE_EXE_LINKER_FLAGS",(allocator *)&local_f0);
    cmMakefile::GetSafeDefinition(pcVar1,&local_118);
    std::__cxx11::string::append((char *)linkFlags);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::append((char *)linkFlags);
    if (local_c8._M_string_length != 0) {
      std::__cxx11::string::string
                ((string *)&local_118,"CMAKE_EXE_LINKER_FLAGS_",(allocator *)&local_f0);
      std::__cxx11::string::append((string *)&local_118);
      cmMakefile::GetSafeDefinition(local_120->Makefile,&local_118);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::~string((string *)&local_118);
    }
    if (local_58._M_string_length == 0) {
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      cmSystemTools::Error
                ("CMake can not determine linker language for target: ",(psVar4->_M_dataplus)._M_p,
                 (char *)0x0,(char *)0x0);
      goto LAB_003a7287;
    }
    AddLanguageFlagsForLinking(local_120,flags,target,&local_58,&local_c8);
    if (local_d0 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(local_120,local_d0,local_88,local_80,frameworkPath,linkPath);
    }
    pcVar1 = local_120->Makefile;
    std::__cxx11::string::string((string *)&local_118,"BUILD_SHARED_LIBS",(allocator *)&local_f0);
    pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_118);
    bVar2 = cmSystemTools::IsOn(pcVar6);
    std::__cxx11::string::~string((string *)&local_118);
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_a8,"CMAKE_SHARED_BUILD_",&local_121);
      std::operator+(&local_f0,&local_a8,&local_58);
      std::__cxx11::string::string((string *)&local_78,"_FLAGS",&local_f1);
      std::operator+(&local_118,&local_f0,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_a8);
      cmMakefile::GetSafeDefinition(local_120->Makefile,&local_118);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::~string((string *)&local_118);
    }
    std::__cxx11::string::string((string *)&local_118,"WIN32_EXECUTABLE",(allocator *)&local_f0);
    bVar2 = cmGeneratorTarget::GetPropertyAsBool(target,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    pcVar1 = local_120->Makefile;
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)&local_118,"CMAKE_CREATE_WIN32_EXE",(allocator *)&local_f0);
      cmMakefile::GetSafeDefinition(pcVar1,&local_118);
      std::__cxx11::string::append((char *)linkFlags);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_118,"CMAKE_CREATE_CONSOLE_EXE",(allocator *)&local_f0);
      cmMakefile::GetSafeDefinition(pcVar1,&local_118);
      std::__cxx11::string::append((char *)linkFlags);
    }
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::append((char *)linkFlags);
    bVar2 = cmGeneratorTarget::IsExecutableWithExports(target);
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_118,"CMAKE_EXE_EXPORTS_",(allocator *)&local_f0)
      ;
      std::__cxx11::string::append((string *)&local_118);
      std::__cxx11::string::append((char *)&local_118);
      cmMakefile::GetSafeDefinition(local_120->Makefile,&local_118);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::~string((string *)&local_118);
    }
    GetLinkLibsCMP0065(&local_118,local_120,&local_58,target);
    if (local_118._M_string_length != 0) {
      std::__cxx11::string::append((string *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    std::__cxx11::string::string((string *)&local_f0,"LINK_FLAGS",(allocator *)&local_a8);
    pcVar6 = cmGeneratorTarget::GetProperty(target,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    if (pcVar6 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (local_c8._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_f0,"LINK_FLAGS_",(allocator *)&local_a8);
      std::__cxx11::string::append((string *)&local_f0);
      pcVar6 = cmGeneratorTarget::GetProperty(target,&local_f0);
      if (pcVar6 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      std::__cxx11::string::~string((string *)&local_f0);
    }
    std::__cxx11::string::~string((string *)&local_118);
    break;
  case STATIC_LIBRARY:
    GetStaticLibraryFlags(local_120,linkFlags,&local_c8,target);
    break;
  case SHARED_LIBRARY:
    pcVar6 = "CMAKE_SHARED_LINKER_FLAGS";
    goto LAB_003a6c98;
  case MODULE_LIBRARY:
    pcVar6 = "CMAKE_MODULE_LINKER_FLAGS";
LAB_003a6c98:
    pcVar1 = local_120->Makefile;
    std::__cxx11::string::string((string *)&local_118,pcVar6,(allocator *)&local_f0);
    cmMakefile::GetSafeDefinition(pcVar1,&local_118);
    std::__cxx11::string::assign((char *)linkFlags);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::append((char *)linkFlags);
    if (local_c8._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_118,pcVar6,(allocator *)&local_f0);
      std::__cxx11::string::append((char *)&local_118);
      std::__cxx11::string::append((string *)&local_118);
      cmMakefile::GetSafeDefinition(local_120->Makefile,&local_118);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::~string((string *)&local_118);
    }
    pcVar1 = local_120->Makefile;
    std::__cxx11::string::string((string *)&local_118,"WIN32",(allocator *)&local_78);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_118);
    if (bVar2) {
      pcVar1 = local_120->Makefile;
      std::__cxx11::string::string((string *)&local_f0,"CYGWIN",&local_121);
      bVar2 = cmMakefile::IsOn(pcVar1,&local_f0);
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_f0);
        goto LAB_003a6dce;
      }
      pcVar1 = local_120->Makefile;
      std::__cxx11::string::string((string *)&local_a8,"MINGW",&local_f1);
      bVar2 = cmMakefile::IsOn(pcVar1,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_118);
      if (!bVar2) {
        local_78._M_dataplus._M_p = (pointer)0x0;
        local_78._M_string_length = 0;
        local_78.field_2._M_allocated_capacity = 0;
        cmGeneratorTarget::GetSourceFiles
                  (target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_78,
                   &local_c8);
        pcVar1 = local_120->Makefile;
        std::__cxx11::string::string
                  ((string *)&local_f0,"CMAKE_LINK_DEF_FILE_FLAG",(allocator *)&local_a8);
        pcVar6 = cmMakefile::GetSafeDefinition(pcVar1,&local_f0);
        local_38 = config;
        std::__cxx11::string::string((string *)&local_118,pcVar6,&local_121);
        std::__cxx11::string::~string((string *)&local_f0);
        this_00 = &local_120->super_cmOutputConverter;
        for (_Var5._M_p = local_78._M_dataplus._M_p;
            _Var5._M_p != (pointer)local_78._M_string_length; _Var5._M_p = _Var5._M_p + 8) {
          this_01 = *(cmSourceFile **)_Var5._M_p;
          psVar4 = cmSourceFile::GetExtension_abi_cxx11_(this_01);
          bVar2 = std::operator==(psVar4,"def");
          if (bVar2) {
            std::__cxx11::string::append((string *)linkFlags);
            psVar4 = cmSourceFile::GetFullPath(this_01,(string *)0x0);
            cmsys::SystemTools::CollapseFullPath(&local_a8,psVar4);
            cmOutputConverter::ConvertToOutputFormat(&local_f0,this_00,&local_a8,SHELL);
            std::__cxx11::string::append((string *)linkFlags);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_a8);
            std::__cxx11::string::append((char *)linkFlags);
          }
        }
        std::__cxx11::string::~string((string *)&local_118);
        std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                  ((_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_78);
        config = local_38;
      }
    }
    else {
LAB_003a6dce:
      std::__cxx11::string::~string((string *)&local_118);
    }
    std::__cxx11::string::string((string *)&local_118,"LINK_FLAGS",(allocator *)&local_f0);
    pcVar6 = cmGeneratorTarget::GetProperty(target,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    if (pcVar6 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (local_c8._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_118,"LINK_FLAGS_",(allocator *)&local_f0);
      std::__cxx11::string::append((string *)&local_118);
      pcVar6 = cmGeneratorTarget::GetProperty(target,&local_118);
      if (pcVar6 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      std::__cxx11::string::~string((string *)&local_118);
    }
    if (local_d0 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(local_120,local_d0,local_88,local_80,frameworkPath,linkPath);
    }
  }
  AppendIPOLinkerFlags(local_120,linkFlags,target,config,&local_58);
LAB_003a7287:
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::string& linkLibs, std::string& flags, std::string& linkFlags,
  std::string& frameworkPath, std::string& linkPath, cmGeneratorTarget* target)
{
  const std::string buildType = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, buildType);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      this->GetStaticLibraryFlags(linkFlags, buildType, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      linkFlags = this->Makefile->GetSafeDefinition(libraryLinkVariable);
      linkFlags += " ";
      if (!buildType.empty()) {
        std::string build = libraryLinkVariable;
        build += "_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
      }
      if (this->Makefile->IsOn("WIN32") &&
          !(this->Makefile->IsOn("CYGWIN") || this->Makefile->IsOn("MINGW"))) {
        std::vector<cmSourceFile*> sources;
        target->GetSourceFiles(sources, buildType);
        std::string defFlag =
          this->Makefile->GetSafeDefinition("CMAKE_LINK_DEF_FILE_FLAG");
        for (std::vector<cmSourceFile*>::const_iterator i = sources.begin();
             i != sources.end(); ++i) {
          cmSourceFile* sf = *i;
          if (sf->GetExtension() == "def") {
            linkFlags += defFlag;
            linkFlags += this->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(sf->GetFullPath()), SHELL);
            linkFlags += " ";
          }
        }
      }
      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      linkFlags += this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
      linkFlags += " ";
      if (!buildType.empty()) {
        std::string build = "CMAKE_EXE_LINKER_FLAGS_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
      }
      if (linkLanguage.empty()) {
        cmSystemTools::Error(
          "CMake can not determine linker language for target: ",
          target->GetName().c_str());
        return;
      }
      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, buildType);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
      if (cmSystemTools::IsOn(
            this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
        std::string sFlagVar = std::string("CMAKE_SHARED_BUILD_") +
          linkLanguage + std::string("_FLAGS");
        linkFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        linkFlags += " ";
      }
      if (target->GetPropertyAsBool("WIN32_EXECUTABLE")) {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_WIN32_EXE");
        linkFlags += " ";
      } else {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_CONSOLE_EXE");
        linkFlags += " ";
      }
      if (target->IsExecutableWithExports()) {
        std::string exportFlagVar = "CMAKE_EXE_EXPORTS_";
        exportFlagVar += linkLanguage;
        exportFlagVar += "_FLAG";

        linkFlags += this->Makefile->GetSafeDefinition(exportFlagVar);
        linkFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        linkFlags += cmp0065Flags;
        linkFlags += " ";
      }

      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }
    } break;
    default:
      break;
  }

  this->AppendIPOLinkerFlags(linkFlags, target, config, linkLanguage);
}